

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

Result * __thiscall Catch::clara::detail::Parser::validate(Parser *this)

{
  bool bVar1;
  reference pAVar2;
  long in_RSI;
  Result *in_RDI;
  Arg *arg;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_> *__range3_1;
  Opt *opt;
  const_iterator __end3;
  const_iterator __begin3;
  vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_> *__range3;
  Result *result;
  Result *this_00;
  __normal_iterator<const_Catch::clara::detail::Arg_*,_std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>_>
  local_48;
  long local_40;
  uint local_38;
  byte local_31;
  reference local_30;
  Opt *local_28;
  __normal_iterator<const_Catch::clara::detail::Opt_*,_std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>_>
  local_20;
  long local_18;
  
  local_18 = in_RSI + 0x30;
  this_00 = in_RDI;
  local_20._M_current =
       (Opt *)std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::
              begin((vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_> *
                    )in_RDI);
  local_28 = (Opt *)std::
                    vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::
                    end((vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>
                         *)in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Catch::clara::detail::Opt_*,_std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>_>
                        *)this_00,
                       (__normal_iterator<const_Catch::clara::detail::Opt_*,_std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>_>
                        *)in_RDI);
    if (!bVar1) {
      local_40 = in_RSI + 0x48;
      local_48._M_current =
           (Arg *)std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>
                  ::begin((vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>
                           *)in_RDI);
      std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::end
                ((vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_> *)
                 in_RDI);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_Catch::clara::detail::Arg_*,_std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>_>
                            *)this_00,
                           (__normal_iterator<const_Catch::clara::detail::Arg_*,_std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>_>
                            *)in_RDI);
        if (!bVar1) {
          BasicResult<void>::ok();
          return this_00;
        }
        pAVar2 = __gnu_cxx::
                 __normal_iterator<const_Catch::clara::detail::Arg_*,_std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>_>
                 ::operator*(&local_48);
        (*(pAVar2->super_ParserRefImpl<Catch::clara::detail::Arg>).
          super_ComposableParserImpl<Catch::clara::detail::Arg>.super_ParserBase._vptr_ParserBase[2]
        )(in_RDI);
        bVar1 = BasicResult::operator_cast_to_bool((BasicResult *)in_RDI);
        local_38 = (uint)!bVar1;
        if (bVar1) {
          BasicResult<void>::~BasicResult(this_00);
        }
        if (local_38 != 0) break;
        __gnu_cxx::
        __normal_iterator<const_Catch::clara::detail::Arg_*,_std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>_>
        ::operator++(&local_48);
      }
      return this_00;
    }
    local_30 = __gnu_cxx::
               __normal_iterator<const_Catch::clara::detail::Opt_*,_std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>_>
               ::operator*(&local_20);
    local_31 = 0;
    (*(local_30->super_ParserRefImpl<Catch::clara::detail::Opt>).
      super_ComposableParserImpl<Catch::clara::detail::Opt>.super_ParserBase._vptr_ParserBase[2])
              (in_RDI);
    bVar1 = BasicResult::operator_cast_to_bool((BasicResult *)in_RDI);
    if (!bVar1) {
      local_31 = 1;
    }
    local_38 = (uint)!bVar1;
    if ((local_31 & 1) == 0) {
      BasicResult<void>::~BasicResult(this_00);
    }
    if (local_38 != 0) break;
    __gnu_cxx::
    __normal_iterator<const_Catch::clara::detail::Opt_*,_std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>_>
    ::operator++(&local_20);
  }
  return this_00;
}

Assistant:

auto validate() const -> Result override {
            for( auto const &opt : m_options ) {
                auto result = opt.validate();
                if( !result )
                    return result;
            }
            for( auto const &arg : m_args ) {
                auto result = arg.validate();
                if( !result )
                    return result;
            }
            return Result::ok();
        }